

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O3

int stbir__edge_wrap(stbir_edge edge,int n,int max)

{
  int iVar1;
  int iVar2;
  
  if (-1 < n && n < max) {
    return n;
  }
  iVar2 = 0;
  switch(edge) {
  case STBIR_EDGE_CLAMP:
    if (-1 < n) {
      iVar2 = max + -1;
      if (n < max) {
        iVar2 = n;
      }
      return iVar2;
    }
    break;
  case STBIR_EDGE_REFLECT:
    if (n < 0) {
      if (n < max) {
        return -n;
      }
      return max + -1;
    }
    if (n < max) {
      return n;
    }
    iVar2 = ~n + max * 2;
    if (max * 2 <= n) {
      iVar2 = 0;
    }
    return iVar2;
  case STBIR_EDGE_WRAP:
    iVar2 = n % max;
    if (n < 0) {
      iVar1 = max + iVar2;
      if (iVar2 == 0) {
        iVar1 = 0;
      }
      return iVar1;
    }
    break;
  case STBIR_EDGE_ZERO:
    break;
  default:
    __assert_fail("!\"Unimplemented edge type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                  ,0x3e3,"int stbir__edge_wrap_slow(stbir_edge, int, int)");
  }
  return iVar2;
}

Assistant:

stbir__inline static int stbir__edge_wrap(stbir_edge edge, int n, int max)
{
    // avoid per-pixel switch
    if (n >= 0 && n < max)
        return n;
    return stbir__edge_wrap_slow(edge, n, max);
}